

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O2

const_iterator * __thiscall
ft::
mapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_ft::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::allocator<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
::find(const_iterator *__return_storage_ptr__,
      mapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_ft::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::allocator<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      *this,key_type *k)

{
  bool bVar1;
  long lVar2;
  treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  **pptVar3;
  node *n;
  
  pptVar3 = &(this->
             super_treeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_ft::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::allocator<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ).m_tree.m_root;
  do {
    n = *pptVar3;
    do {
      bVar1 = treeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_ft::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::allocator<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::validNode(&this->
                           super_treeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_ft::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::allocator<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          ,n);
      if (!bVar1) {
        n = (this->
            super_treeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_ft::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::allocator<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ).m_tree.m_last;
LAB_00108a1c:
        (__return_storage_ptr__->
        super_treeIterator<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_ft::allocator<ft::treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
        ).m_tree = &(this->
                    super_treeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_ft::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::allocator<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ).m_tree;
        (__return_storage_ptr__->
        super_treeIterator<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_ft::allocator<ft::treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
        ).m_node = n;
        (__return_storage_ptr__->
        super_treeIterator<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_ft::allocator<ft::treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
        )._vptr_treeIterator = (_func_int **)&PTR__treeIterator_001139d8;
        return __return_storage_ptr__;
      }
      bVar1 = equal(this,(key_type *)n,k);
      if (bVar1) goto LAB_00108a1c;
      bVar1 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)n,
                             k);
      if (bVar1) {
        lVar2 = 0x38;
        break;
      }
      bVar1 = std::operator<(k,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               n);
      lVar2 = 0x30;
    } while (!bVar1);
    pptVar3 = (treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
               **)((long)&(n->value).first._M_dataplus._M_p + lVar2);
  } while( true );
}

Assistant:

const_iterator	find(key_type const & k) const
	{
		node*	node = this->root();
		while (this->validNode(node))
		{
			if (this->equal(node->value.first, k)) return const_iterator(this->m_tree, node);
			else if (this->key_comp()(node->value.first, k)) node = node->right;
			else if (this->key_comp()(k, node->value.first)) node = node->left;
		}
		return this->end();
	}